

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_FadCst<double>_>
::val(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_FadCst<double>_>
      *this)

{
  long in_RSI;
  Fad<double> *in_RDI;
  FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *in_stack_ffffffffffffffd8;
  Fad<double> *in_stack_ffffffffffffffe0;
  Fad<double> *in_stack_ffffffffffffffe8;
  
  FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_FadCst<double>_>_>::val
            ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_FadCst<double>_>_> *)
             in_RDI);
  FadCst<double>::val((FadCst<double> *)(in_RSI + 8));
  operator*<Fad<double>,_double,_nullptr>
            (in_stack_ffffffffffffffe8,(double)in_stack_ffffffffffffffe0);
  Fad<double>::Fad<FadBinaryMul<Fad<double>,FadCst<double>>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *)in_RDI);
  Fad<double>::~Fad(in_RDI);
  return in_RDI;
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}